

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.h
# Opt level: O3

Matte * __thiscall pm::World::createMaterial<pm::Matte>(World *this)

{
  tuple<pm::Material_*,_std::default_delete<pm::Material>_> this_00;
  pointer *__ptr;
  __uniq_ptr_impl<pm::Material,_std::default_delete<pm::Material>_> local_18;
  
  this_00.super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
  super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>)operator_new(0x70);
  Matte::Matte((Matte *)this_00.
                        super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
                        super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl);
  local_18._M_t.super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
  super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl =
       (tuple<pm::Material_*,_std::default_delete<pm::Material>_>)
       (tuple<pm::Material_*,_std::default_delete<pm::Material>_>)
       this_00.super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
       super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>,std::allocator<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>>>
  ::emplace_back<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>>
            ((vector<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>,std::allocator<std::unique_ptr<pm::Material,std::default_delete<pm::Material>>>>
              *)&this->materials_,
             (unique_ptr<pm::Material,_std::default_delete<pm::Material>_> *)&local_18);
  if ((_Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>)
      local_18._M_t.super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
      super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl != (Material *)0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>
                          .super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl + 8))();
  }
  return (Matte *)(this->materials_).
                  super__Vector_base<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>,_std::allocator<std::unique_ptr<pm::Material,_std::default_delete<pm::Material>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                  super___uniq_ptr_impl<pm::Material,_std::default_delete<pm::Material>_>._M_t.
                  super__Tuple_impl<0UL,_pm::Material_*,_std::default_delete<pm::Material>_>.
                  super__Head_base<0UL,_pm::Material_*,_false>._M_head_impl;
}

Assistant:

T *World::createMaterial(Args &&... args)
{
	materials_.push_back(std::make_unique<T>(std::forward<Args>(args)...));
	return static_cast<T *>(materials_.back().get());
}